

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

var cs::try_move(var *val)

{
  proxy *ppVar1;
  proxy *in_RDI;
  
  ppVar1 = val->mDat;
  if (ppVar1 != (proxy *)0x0) {
    if (ppVar1->refcount == 1) {
      ppVar1->protect_level = 0;
      ppVar1->is_rvalue = true;
    }
    if (ppVar1 != (proxy *)0x0) {
      ppVar1->refcount = ppVar1->refcount + 1;
    }
  }
  *(proxy **)in_RDI = ppVar1;
  return (var)in_RDI;
}

Assistant:

var try_move(const var &val)
	{
		val.try_move();
		return val;
	}